

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_1::RenderingContext::initGLFunctions(RenderingContext *this,Functions *gl)

{
  int iVar1;
  EGLint majorVersion;
  uint uVar2;
  int *piVar3;
  int iVar4;
  char *extensions [1];
  char *local_8;
  
  local_8 = "GL_KHR_robustness";
  piVar3 = this->m_attribList;
  iVar4 = 0;
  uVar2 = 1;
  do {
    iVar1 = *piVar3;
    do {
      while (iVar1 < 0x30bf) {
        if (iVar1 == 0x3038) {
          EglTestContext::initGLFunctions
                    (this->m_eglTestCtx,gl,(ApiType)((iVar4 << 4 | uVar2) & 0x3ff),1,&local_8);
          return;
        }
        if (iVar1 == 0x3098) {
          uVar2 = piVar3[1];
          goto LAB_00e5acf4;
        }
      }
      if (iVar1 == 0x30bf) break;
      if (iVar1 == 0x30fb) {
        iVar4 = piVar3[1];
        break;
      }
    } while (iVar1 != 0x3138);
LAB_00e5acf4:
    piVar3 = piVar3 + 2;
  } while( true );
}

Assistant:

void RenderingContext::initGLFunctions (glw::Functions *gl)
{
	const char* extensions[] = { "GL_KHR_robustness" };
	m_eglTestCtx.initGLFunctions(gl, attribListToContextType(m_attribList).getAPI(), DE_LENGTH_OF_ARRAY(extensions), &extensions[0]);
}